

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

int shop_item_cost(obj *obj)

{
  level *lev;
  boolean bVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  monst *mtmp;
  long lVar4;
  int iVar5;
  xchar y;
  xchar x;
  undefined8 uStack_28;
  undefined2 uVar6;
  
  iVar5 = 0;
  uStack_28 = in_RAX;
  bVar1 = get_obj_location(obj,(xchar *)((long)&uStack_28 + 7),(xchar *)((long)&uStack_28 + 6),0);
  if (bVar1 == '\0') {
    return 0;
  }
  if ((*(uint *)&obj->field_0x4a & 4) == 0) {
    if ((*(uint *)&obj->field_0x4a & 8) != 0) {
      return 0;
    }
    if (obj->where != '\x01') {
      return 0;
    }
    bVar1 = costly_spot(uStack_28._7_1_,uStack_28._6_1_);
    if (bVar1 == '\0') {
      return 0;
    }
  }
  lev = obj->olev;
  pcVar3 = in_rooms(lev,uStack_28._7_1_,uStack_28._6_1_,0x12);
  uVar6 = (undefined2)((ulong)uStack_28 >> 0x38);
  mtmp = shop_keeper(lev,*pcVar3);
  if ((mtmp != (monst *)0x0) && (uStack_28._6_2_ = uVar6, iVar2 = inhishop(mtmp), iVar2 != 0)) {
    bVar1 = costly_spot(uStack_28._7_1_,uStack_28._6_1_);
    if ((bVar1 != '\0') && ((u.ushops[0] != '\0' && (obj->oclass != '\f')))) {
      iVar5 = 0;
      if ((uball != obj) && (iVar5 = 0, uchain != obj)) {
        iVar5 = obj->quan;
        lVar4 = get_cost(obj,mtmp);
        iVar5 = (int)lVar4 * iVar5;
      }
      if (obj->cobj != (obj *)0x0) {
        lVar4 = contained_cost(obj,mtmp,0,'\0','\0');
        iVar5 = iVar5 + (int)lVar4;
      }
    }
  }
  return iVar5;
}

Assistant:

int shop_item_cost(const struct obj *obj)
{
	struct monst *shkp;
	xchar x, y;
	int cost=0;

	if (get_obj_location(obj, &x, &y, 0) && (obj->unpaid ||
	    (obj->where==OBJ_FLOOR && !obj->no_charge && costly_spot(x,y)))) {
		if (!(shkp = shop_keeper(obj->olev, *in_rooms(obj->olev, x, y, SHOPBASE)))) return 0;
		if (!inhishop(shkp)) return 0;
		if (!costly_spot(x, y)) return 0;
		if (!*u.ushops) return 0;

		if (obj->oclass != COIN_CLASS) {
			cost = (obj == uball || obj == uchain) ? 0L :
				obj->quan * get_cost(obj, shkp);
			if (Has_contents(obj))
				cost += contained_cost(obj, shkp, 0L, FALSE, FALSE);
		}
	}
	return cost;
}